

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

Type * __thiscall
Fixpp::
get<Fixpp::TagT<553u,Fixpp::Type::String>,Fixpp::VersionnedMessageRef<Fixpp::v44::Version,Fixpp::Chars<(char)66,(char)70>,Fixpp::Required<Fixpp::TagT<923u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<924u,Fixpp::Type::Int>>,Fixpp::Required<Fixpp::TagT<553u,Fixpp::Type::String>>,Fixpp::TagT<554u,Fixpp::Type::String>,Fixpp::TagT<925u,Fixpp::Type::Int>,Fixpp::TagT<95u,Fixpp::Type::Int>,Fixpp::TagT<96u,Fixpp::Type::Data>>>
          (Type *__return_storage_ptr__,Fixpp *this,
          VersionnedMessageRef<Fixpp::v44::Version,_Fixpp::Chars<_B_,__F_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<924U,_Fixpp::Type::Int>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<554U,_Fixpp::Type::String>,_Fixpp::TagT<925U,_Fixpp::Type::Int>,_Fixpp::TagT<95U,_Fixpp::Type::Int>,_Fixpp::TagT<96U,_Fixpp::Type::Data>_>
          *message)

{
  long lVar1;
  long lVar2;
  runtime_error *this_00;
  
  if (((byte)this[0x78] & 4) != 0) {
    lVar1 = *(long *)(this + 0x20);
    lVar2 = *(long *)(this + 0x28);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,lVar1,lVar2 + lVar1);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Bad tag access: tag is not present in message");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

decltype(auto)
    get(const Message& message)
    {
        using Index = details::TagIndex<typename Message::TagsList, Tag>;
        static_assert(Index::Valid, "Invalid tag for given message");

        if (!message.allBits.test(static_cast<size_t>(Index::Value)))
            throw std::runtime_error("Bad tag access: tag is not present in message");

        return meta::get<Index::Value>(message.values).get();
    }